

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

void __thiscall
ExpressionContext::AddVariable(ExpressionContext *this,VariableData *variable,bool visible)

{
  ScopeData *pSVar1;
  uint hash;
  undefined7 in_register_00000011;
  IdentifierLookupResult value;
  VariableData *local_20;
  
  local_20 = variable;
  SmallArray<VariableData_*,_4U>::push_back(&this->scope->variables,&local_20);
  SmallArray<VariableData_*,_4U>::push_back(&this->scope->allVariables,&local_20);
  SmallArray<VariableData_*,_128U>::push_back(&this->variables,&local_20);
  if ((int)CONCAT71(in_register_00000011,visible) != 0) {
    pSVar1 = this->scope;
    if (pSVar1->type == SCOPE_NAMESPACE) {
      pSVar1 = this->globalScope;
    }
    hash = InplaceStr::hash(&local_20->name->name);
    value.function = (FunctionData *)0x0;
    value.variable = local_20;
    DirectChainedMap<IdentifierLookupResult>::insert(&pSVar1->idLookupMap,hash,value);
  }
  return;
}

Assistant:

void ExpressionContext::AddVariable(VariableData *variable, bool visible)
{
	scope->variables.push_back(variable);
	scope->allVariables.push_back(variable);

	variables.push_back(variable);

	if(visible)
	{
		if(scope->type == SCOPE_NAMESPACE)
			globalScope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
		else
			scope->idLookupMap.insert(variable->name->name.hash(), IdentifierLookupResult(variable));
	}
}